

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void spell_deafen(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  char *format;
  AFFECT_DATA af;
  
  if (ch == (CHAR_DATA *)vo) {
    send_to_char("Deafen who?\n\r",ch);
    return;
  }
  bVar1 = is_affected((CHAR_DATA *)vo,sn);
  if (bVar1) {
    format = "$N is already deaf.";
  }
  else {
    bVar1 = saves_spell(level + -2,(CHAR_DATA *)vo,0x11);
    if (!bVar1) {
      init_affect(&af);
      af.where = 0;
      af.aftype = 0;
      af.level = (short)level;
      af.duration = (short)(level / 0xc);
      af.location = 0;
      af.modifier = 0;
      af.mod_name = 10;
      af.type = (short)sn;
      affect_to_char((CHAR_DATA *)vo,&af);
      act("You have deafened $N!",ch,(void *)0x0,vo,3);
      send_to_char("The world around you fades to silence.\n\r",(CHAR_DATA *)vo);
      return;
    }
    format = "You fail to deafen $N.";
  }
  act(format,ch,(void *)0x0,vo,3);
  return;
}

Assistant:

void spell_deafen(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (ch == victim)
	{
		send_to_char("Deafen who?\n\r", ch);
		return;
	}

	if (is_affected(victim, sn))
	{
		act("$N is already deaf.", ch, nullptr, victim, TO_CHAR);
		return;
	}

	if (saves_spell(level - 2, victim, DAM_CHARM))
	{
		act("You fail to deafen $N.", ch, 0, victim, TO_CHAR);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.level = level;
	af.duration = level / 12;
	af.modifier = 0;
	af.location = 0;
	af.mod_name = MOD_HEARING;
	affect_to_char(victim, &af);

	act("You have deafened $N!", ch, nullptr, victim, TO_CHAR);
	send_to_char("The world around you fades to silence.\n\r", victim);
}